

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O3

void search_and_patch_r(string *indent,uint8_t *cstart,uint8_t *cend,pattern_t *pattern)

{
  uchar uVar1;
  uchar uVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  pointer puVar5;
  pointer ppVar6;
  pointer pcVar7;
  uchar *__first1;
  ostream *poVar8;
  uchar *puVar9;
  pointer puVar10;
  uint8_t *cend_00;
  uchar uVar11;
  anon_class_8_1_a2015b58 __predicate;
  anon_class_8_1_a2015b58 __predicate_00;
  anon_class_8_1_a2015b58 __predicate_01;
  pointer ppVar12;
  pattern_s child;
  string local_1b0;
  uchar *local_190;
  pattern_t *local_188;
  vector<pattern_s,_std::allocator<pattern_s>_> *local_180;
  vector<pattern_s,_std::allocator<pattern_s>_> *local_178;
  pattern_s local_170;
  pattern_s local_d0;
  
  uVar1 = pattern->replace_wildcard;
  __predicate.wildcard._1_7_ = 0;
  __predicate.wildcard._0_1_ = pattern->wildcard;
  __predicate_00.wildcard._0_4_ = (uint)pattern->wildcard;
  __first1 = std::
             search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                       (cstart,cend,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(pattern->patt).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(pattern->patt).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish,__predicate);
  if (__first1 < cend) {
    local_180 = &local_d0.childs;
    local_178 = &local_170.childs;
    local_190 = __first1;
    local_188 = pattern;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Found <",7);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pattern->name)._M_dataplus._M_p,(pattern->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"> at 0x",7);
      *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
           *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      _Var3._M_current =
           (pattern->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      _Var4._M_current =
           (pattern->validate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      puVar10 = (pattern->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 = (pattern->replace).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (_Var3._M_current == _Var4._M_current) {
        if (puVar10 != puVar5) {
LAB_001036d5:
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                              indent->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Patching...",0xb);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          puVar10 = (pattern->replace).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar5 = (pattern->replace).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (puVar10 != puVar5) {
            puVar9 = __first1 + pattern->replace_offset;
            do {
              uVar2 = *puVar10;
              uVar11 = *puVar9;
              if (uVar1 != uVar2) {
                uVar11 = uVar2;
              }
              if (uVar1 == '\0') {
                uVar11 = uVar2;
              }
              *puVar9 = uVar11;
              puVar10 = puVar10 + 1;
              puVar9 = puVar9 + 1;
            } while (puVar10 != puVar5);
          }
        }
      }
      else if (puVar10 != puVar5) {
        __predicate_00.wildcard._4_4_ = 0;
        puVar9 = std::
                 search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                           (__first1,__first1 +
                                     (long)(_Var4._M_current + (5 - (long)_Var3._M_current)),_Var3,
                            _Var4,__predicate_00);
        if ((puVar9 < __first1 + (long)(_Var4._M_current + (5 - (long)_Var3._M_current))) ||
           ((force_invalid & 1U) != 0)) goto LAB_001036d5;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                            indent->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   "Can\'t apply patch! (search region don\'t pass validation), use -force_invalid to force."
                   ,0x56);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      ppVar6 = (pattern->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ppVar12 = (pattern->childs).super__Vector_base<pattern_s,_std::allocator<pattern_s>_>.
                     _M_impl.super__Vector_impl_data._M_start; pattern = local_188,
          ppVar12 != ppVar6; ppVar12 = ppVar12 + 1) {
        pattern_s::pattern_s(&local_170,ppVar12);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,
                            indent->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Scanning SUB:<",0xe);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_170.name._M_dataplus._M_p,local_170.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,">",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        cend_00 = __first1 + local_170.max_search;
        if (local_170.max_search == 0) {
          cend_00 = cend;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (indent,"...");
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        pcVar7 = (indent->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,pcVar7,pcVar7 + indent->_M_string_length);
        pattern_s::pattern_s(&local_d0,&local_170);
        search_and_patch_r(&local_1b0,__first1,cend_00,&local_d0);
        std::vector<pattern_s,_std::allocator<pattern_s>_>::~vector(local_180);
        if (local_d0.validate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.validate.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.replace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.replace.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.patt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.patt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.name._M_dataplus._M_p != &local_d0.name.field_2) {
          operator_delete(local_d0.name._M_dataplus._M_p,
                          local_d0.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        std::vector<pattern_s,_std::allocator<pattern_s>_>::~vector(local_178);
        if (local_170.validate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.validate.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.validate.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.replace.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.replace.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.replace.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_170.patt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.patt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.patt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.name._M_dataplus._M_p != &local_170.name.field_2) {
          operator_delete(local_170.name._M_dataplus._M_p,
                          local_170.name.field_2._M_allocated_capacity + 1);
        }
      }
      _Var3._M_current =
           (local_188->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      _Var4._M_current =
           (local_188->patt).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      __predicate_01.wildcard._4_4_ = 0;
      __predicate_01.wildcard._0_4_ = (uint)__predicate_00.wildcard;
      __first1 = std::
                 search<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,search_and_patch_r(std::__cxx11::string,unsigned_char*,unsigned_char*,pattern_s)::__0>
                           (__first1 + ((long)_Var4._M_current - (long)_Var3._M_current),cend,_Var3,
                            _Var4,__predicate_01);
    } while (__first1 < cend);
    if (local_190 < cend) {
      return;
    }
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(indent->_M_dataplus)._M_p,indent->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Warning: <",10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(pattern->name)._M_dataplus._M_p,(pattern->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"> was not found!",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return;
}

Assistant:

void search_and_patch_r(string indent, uint8_t* cstart, uint8_t* cend, pattern_t pattern)
{
    const uint8_t wildcard = pattern.wildcard;
    const uint8_t replace_wildcard = pattern.replace_wildcard;
    auto comparer = [&wildcard](uint8_t val1, uint8_t val2)
    {
        return (val1 == val2 || (wildcard && val2 == wildcard));
    };
    auto comparer2 = [&replace_wildcard](uint8_t val, uint8_t val2)
    {
        if (!replace_wildcard)
            return val;
        else if (val == replace_wildcard)
        {
            return val2;
        }

        return val;
    };
    int found = 0;
    for (;;)
    {
        uint8_t* res = std::search(cstart, cend, pattern.patt.begin(), pattern.patt.end(), comparer);
        if (res >= cend)
        {
            if(!found)
                std::cout << indent << "Warning: <" << pattern.name << "> was not found!" << std::endl;
            break;
        }
        found++;
        std::cout << indent << "Found <" << pattern.name << "> at 0x" << std::hex << (res-cstart) << std::endl;
        bool patch = true;
        if (!pattern.validate.empty())
        {
            auto found = std::search(res, res + pattern.validate.size() + 5, pattern.validate.begin(), pattern.validate.end(), comparer);
            if (found >= res + pattern.validate.size() + 5)
            {
                patch = force_invalid;
            }
        }
        if (!pattern.replace.empty())
        {
            if (patch)
            {
                std::cout << indent << "Patching..." << std::endl;
                std::transform(pattern.replace.begin(), pattern.replace.end(), res + pattern.replace_offset, res + pattern.replace_offset, comparer2);
            }
            else
            {
                std::cout << indent << "Can't apply patch! (search region don't pass validation), use -force_invalid to force." << std::endl;
            }
        }
        if (!pattern.childs.empty())
        {
            for (auto child : pattern.childs)
            {
                std::cout << indent << "Scanning SUB:<" << child.name << ">" << std::endl;
                auto end = child.max_search ? res + child.max_search : cend;
                indent += "...";
                search_and_patch_r(indent, res, end, child);
            }
        }
        cstart = res + pattern.patt.size();
    }
}